

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  ImVector<ImVec2> *this_00;
  int iVar1;
  int iVar2;
  undefined4 unaff_R12D;
  uint uVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int a_max_sample;
  int a_min_sample;
  float fVar12;
  float local_98;
  ImVec2 local_40;
  float local_38;
  undefined1 auVar10 [16];
  
  if (radius < 0.5) {
    ImVector<ImVec2>::push_back(&this->_Path,center);
    return;
  }
  if (num_segments < 1) {
    if (radius <= this->_Data->ArcFastRadiusCutoff) {
      fVar6 = (a_min * 48.0) / 6.2831855;
      fVar12 = (a_max * 48.0) / 6.2831855;
      if (a_min <= a_max) {
        fVar6 = ceilf(fVar6);
        fVar12 = ImFloorSigned(fVar12);
        a_max_sample = (int)fVar12;
        a_min_sample = (int)fVar6;
        iVar1 = a_max_sample - a_min_sample;
        fVar6 = extraout_XMM0_Db_01;
        fVar12 = extraout_XMM0_Db_02;
      }
      else {
        fVar6 = ImFloorSigned(fVar6);
        fVar12 = ceilf(fVar12);
        a_max_sample = (int)fVar12;
        a_min_sample = (int)fVar6;
        iVar1 = a_min_sample - a_max_sample;
        fVar6 = extraout_XMM0_Db;
        fVar12 = extraout_XMM0_Db_00;
      }
      iVar2 = 0;
      if (0 < iVar1) {
        iVar2 = iVar1;
      }
      auVar9._0_4_ = (float)a_max_sample * -3.1415927 + (float)a_max_sample * -3.1415927;
      auVar9._4_4_ = (float)a_min_sample * -3.1415927 + (float)a_min_sample * -3.1415927;
      auVar9._8_4_ = (float)(int)fVar12 * 0.0 + (float)(int)fVar12 * 0.0;
      auVar9._12_4_ = (float)(int)fVar6 * 0.0 + (float)(int)fVar6 * 0.0;
      auVar9 = divps(auVar9,_DAT_0022e4c0);
      iVar4 = -(uint)(1e-05 <= ABS(a_max + auVar9._0_4_));
      iVar5 = -(uint)(1e-05 <= ABS(a_min + auVar9._4_4_));
      auVar11._4_4_ = iVar5;
      auVar11._0_4_ = iVar4;
      auVar11._8_4_ = iVar5;
      auVar11._12_4_ = iVar5;
      auVar10._8_8_ = auVar11._8_8_;
      auVar10._4_4_ = iVar4;
      auVar10._0_4_ = iVar4;
      uVar3 = movmskpd(unaff_R12D,auVar10);
      this_00 = &this->_Path;
      ImVector<ImVec2>::reserve
                (this_00,(uVar3 >> 1 & 0x7f) + (uVar3 & 1) + iVar2 + (this->_Path).Size + 1);
      if ((uVar3 & 2) != 0) {
        fVar6 = center->x;
        local_38 = cosf(a_min);
        fVar12 = center->y;
        fVar7 = sinf(a_min);
        local_40.x = radius * local_38 + fVar6;
        local_40.y = radius * fVar7 + fVar12;
        ImVector<ImVec2>::push_back(this_00,&local_40);
      }
      if (0 < iVar1) {
        _PathArcToFastEx(this,center,radius,a_min_sample,a_max_sample,0);
      }
      if ((uVar3 & 1) != 0) {
        fVar6 = center->x;
        fVar7 = cosf(a_max);
        fVar12 = center->y;
        fVar8 = sinf(a_max);
        local_40.x = radius * fVar7 + fVar6;
        local_40.y = radius * fVar8 + fVar12;
        ImVector<ImVec2>::push_back(this_00,&local_40);
      }
      return;
    }
    local_98 = ABS(a_max - a_min);
    iVar1 = _CalcCircleAutoSegmentCount(this,radius);
    fVar6 = ceilf(((float)iVar1 * local_98) / 6.2831855);
    num_segments = (int)(6.2831855 / local_98);
    if ((int)(6.2831855 / local_98) < (int)fVar6) {
      num_segments = (int)fVar6;
    }
  }
  _PathArcToN(this,center,radius,a_min,a_max,num_segments);
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius < 0.5f)
    {
        _Path.push_back(center);
        return;
    }

    if (num_segments > 0)
    {
        _PathArcToN(center, radius, a_min, a_max, num_segments);
        return;
    }

    // Automatic segment count
    if (radius <= _Data->ArcFastRadiusCutoff)
    {
        const bool a_is_reverse = a_max < a_min;

        // We are going to use precomputed values for mid samples.
        // Determine first and last sample in lookup table that belong to the arc.
        const float a_min_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_min / (IM_PI * 2.0f);
        const float a_max_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_max / (IM_PI * 2.0f);

        const int a_min_sample = a_is_reverse ? (int)ImFloorSigned(a_min_sample_f) : (int)ImCeil(a_min_sample_f);
        const int a_max_sample = a_is_reverse ? (int)ImCeil(a_max_sample_f) : (int)ImFloorSigned(a_max_sample_f);
        const int a_mid_samples = a_is_reverse ? ImMax(a_min_sample - a_max_sample, 0) : ImMax(a_max_sample - a_min_sample, 0);

        const float a_min_segment_angle = a_min_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const float a_max_segment_angle = a_max_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const bool a_emit_start = ImAbs(a_min_segment_angle - a_min) >= 1e-5f;
        const bool a_emit_end = ImAbs(a_max - a_max_segment_angle) >= 1e-5f;

        _Path.reserve(_Path.Size + (a_mid_samples + 1 + (a_emit_start ? 1 : 0) + (a_emit_end ? 1 : 0)));
        if (a_emit_start)
            _Path.push_back(ImVec2(center.x + ImCos(a_min) * radius, center.y + ImSin(a_min) * radius));
        if (a_mid_samples > 0)
            _PathArcToFastEx(center, radius, a_min_sample, a_max_sample, 0);
        if (a_emit_end)
            _Path.push_back(ImVec2(center.x + ImCos(a_max) * radius, center.y + ImSin(a_max) * radius));
    }
    else
    {
        const float arc_length = ImAbs(a_max - a_min);
        const int circle_segment_count = _CalcCircleAutoSegmentCount(radius);
        const int arc_segment_count = ImMax((int)ImCeil(circle_segment_count * arc_length / (IM_PI * 2.0f)), (int)(2.0f * IM_PI / arc_length));
        _PathArcToN(center, radius, a_min, a_max, arc_segment_count);
    }
}